

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O1

void animator_changed_demon(Am_Slot slot)

{
  bool bVar1;
  int iVar2;
  Animation_Constraint *this;
  Am_Constraint_Iterator iter;
  Am_Constraint_Iterator local_30;
  Am_Slot local_20;
  
  Am_Constraint_Iterator::Am_Constraint_Iterator(&local_30,&local_20);
  Am_Constraint_Iterator::Start(&local_30);
  bVar1 = Am_Constraint_Iterator::Last(&local_30);
  if (!bVar1) {
    do {
      this = (Animation_Constraint *)Am_Constraint_Iterator::Get(&local_30);
      iVar2 = (**(this->super_Am_Constraint).super_Am_Registered_Type._vptr_Am_Registered_Type)
                        (this);
      if ((Am_ID_Tag)iVar2 == Animation_Constraint::id) {
        Animation_Constraint::Update(this);
        return;
      }
      Am_Constraint_Iterator::Next(&local_30);
      bVar1 = Am_Constraint_Iterator::Last(&local_30);
    } while (!bVar1);
  }
  return;
}

Assistant:

static void
animator_changed_demon(Am_Slot slot)
{
  Am_Constraint_Iterator iter = slot;
  Am_Constraint *curr;
  for (iter.Start(); !iter.Last(); iter.Next()) {
    curr = iter.Get();
    if (curr->ID() == Animation_Constraint::id) {
      ((Animation_Constraint *)curr)->Update();
      break;
    }
  }
}